

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_pivot.cpp
# Opt level: O3

OperatorResultType __thiscall
duckdb::PhysicalPivot::Execute
          (PhysicalPivot *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk,
          GlobalOperatorState *gstate,OperatorState *state)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  data_ptr_t pdVar6;
  reference pvVar7;
  reference other;
  Vector *pVVar8;
  const_reference value;
  const_iterator cVar9;
  InternalException *this_00;
  size_type __n;
  long lVar10;
  size_type __n_00;
  ulong uVar11;
  long lVar12;
  idx_t index;
  Value local_70;
  
  DataChunk::Flatten(input);
  if ((this->bound_pivot).group_count != 0) {
    __n_00 = 0;
    do {
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&chunk->data,__n_00);
      other = vector<duckdb::Vector,_true>::operator[](&input->data,__n_00);
      Vector::Reference(pvVar7,other);
      __n_00 = __n_00 + 1;
    } while (__n_00 < (this->bound_pivot).group_count);
  }
  pvVar7 = vector<duckdb::Vector,_true>::back(&input->data);
  pdVar1 = pvVar7->data;
  pvVar7 = vector<duckdb::Vector,_true>::back(&input->data);
  pVVar8 = ListVector::GetEntry(pvVar7);
  pdVar2 = pVVar8->data;
  uVar11 = (this->bound_pivot).group_count;
  if (uVar11 < (ulong)(((long)(chunk->data).
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(chunk->data).
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5))
  {
    __n = 0;
    do {
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&chunk->data,uVar11);
      value = vector<duckdb::Value,_true>::operator[](&this->empty_aggregates,__n);
      Vector::Reference(pvVar7,value);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&chunk->data,uVar11);
      Vector::Flatten(pvVar7,input->count);
      __n = __n + 1;
      if ((ulong)((long)(this->empty_aggregates).
                        super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->empty_aggregates).
                        super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start >> 6) <= __n) {
        __n = 0;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(((long)(chunk->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(chunk->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  uVar11 = input->count;
  if (uVar11 == 0) {
    uVar11 = 0;
  }
  else {
    index = 0;
    do {
      lVar12 = index * 0x10;
      lVar3 = *(long *)(pdVar1 + lVar12 + 8);
      if (lVar3 != 0) {
        lVar4 = *(long *)(pdVar1 + lVar12);
        lVar10 = 0;
        do {
          cVar9 = ::std::
                  _Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_long>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(this->pivot_map)._M_h,(key_type *)(pdVar2 + lVar10 * 0x10 + lVar4 * 0x10)
                        );
          if ((cVar9.
               super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_long>,_true>.
               _M_cur != (__node_type *)0x0) &&
             ((this->empty_aggregates).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (this->empty_aggregates).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start)) {
            lVar5 = *(long *)((long)cVar9.
                                    super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_long>,_true>
                                    ._M_cur + 0x18);
            uVar11 = 0;
            do {
              pvVar7 = vector<duckdb::Vector,_true>::operator[]
                                 (&input->data,(this->bound_pivot).group_count + uVar11);
              pdVar6 = pvVar7->data;
              pvVar7 = vector<duckdb::Vector,_true>::operator[]
                                 (&input->data,(this->bound_pivot).group_count + uVar11);
              pVVar8 = ListVector::GetEntry(pvVar7);
              if (lVar3 != *(long *)(pdVar6 + lVar12 + 8)) {
                this_00 = (InternalException *)__cxa_allocate_exception(0x10);
                local_70.type_._0_8_ = (long)&local_70 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_70,
                           "Pivot - unaligned lists between values and columns!?","");
                InternalException::InternalException(this_00,(string *)&local_70);
                __cxa_throw(this_00,&InternalException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              pvVar7 = vector<duckdb::Vector,_true>::operator[](&chunk->data,lVar5 + uVar11);
              Vector::GetValue(&local_70,pVVar8,*(long *)(pdVar6 + lVar12) + lVar10);
              Vector::SetValue(pvVar7,index,&local_70);
              Value::~Value(&local_70);
              uVar11 = uVar11 + 1;
            } while (uVar11 < (ulong)((long)(this->empty_aggregates).
                                            super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                            .
                                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->empty_aggregates).
                                            super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                            .
                                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 6));
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar3);
        uVar11 = input->count;
      }
      index = index + 1;
    } while (index < uVar11);
  }
  chunk->count = uVar11;
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType PhysicalPivot::Execute(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                          GlobalOperatorState &gstate, OperatorState &state) const {
	// copy the groups as-is
	input.Flatten();
	for (idx_t i = 0; i < bound_pivot.group_count; i++) {
		chunk.data[i].Reference(input.data[i]);
	}
	auto pivot_column_lists = FlatVector::GetData<list_entry_t>(input.data.back());
	auto &pivot_column_values = ListVector::GetEntry(input.data.back());
	auto pivot_columns = FlatVector::GetData<string_t>(pivot_column_values);

	// initialize all aggregate columns with the empty aggregate value
	// if there are multiple aggregates the columns are in order of [AGGR1][AGGR2][AGGR1][AGGR2]
	// so we need to alternate the empty_aggregate that we use
	idx_t aggregate = 0;
	for (idx_t c = bound_pivot.group_count; c < chunk.ColumnCount(); c++) {
		chunk.data[c].Reference(empty_aggregates[aggregate]);
		chunk.data[c].Flatten(input.size());
		aggregate++;
		if (aggregate >= empty_aggregates.size()) {
			aggregate = 0;
		}
	}

	// move the pivots to the given columns
	for (idx_t r = 0; r < input.size(); r++) {
		auto list = pivot_column_lists[r];
		for (idx_t l = 0; l < list.length; l++) {
			// figure out the column value number of this list
			auto &column_name = pivot_columns[list.offset + l];
			auto entry = pivot_map.find(column_name);
			if (entry == pivot_map.end()) {
				// column entry not found in map - that means this element is explicitly excluded from the pivot list
				continue;
			}
			auto column_idx = entry->second;
			for (idx_t aggr = 0; aggr < empty_aggregates.size(); aggr++) {
				auto pivot_value_lists = FlatVector::GetData<list_entry_t>(input.data[bound_pivot.group_count + aggr]);
				auto &pivot_value_child = ListVector::GetEntry(input.data[bound_pivot.group_count + aggr]);
				if (list.length != pivot_value_lists[r].length) {
					throw InternalException("Pivot - unaligned lists between values and columns!?");
				}
				chunk.data[column_idx + aggr].SetValue(r, pivot_value_child.GetValue(pivot_value_lists[r].offset + l));
			}
		}
	}
	chunk.SetCardinality(input.size());
	return OperatorResultType::NEED_MORE_INPUT;
}